

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HubContext.cpp
# Opt level: O2

shared_ptr<SL::WS_LITE::IWSListener_Configuration> __thiscall
SL::WS_LITE::HubContext_Configuration::CreateListener
          (HubContext_Configuration *this,PortNumber port,NetworkProtocol protocol,
          ExtensionOptions options)

{
  long lVar1;
  long *plVar2;
  undefined8 __p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<SL::WS_LITE::ThreadContext> *t;
  long *plVar4;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined6 in_register_00000032;
  undefined1 in_R8B;
  ushort uVar5;
  shared_ptr<SL::WS_LITE::IWSListener_Configuration> sVar6;
  undefined1 local_60 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<SL::WS_LITE::HubContext> local_48;
  undefined8 uStack_38;
  undefined4 local_30;
  
  uVar5 = (ushort)protocol;
  if ((int)CONCAT71(in_register_00000009,options) == 0) {
    HubContext::getnextContext((HubContext *)(local_60 + 8));
    local_30 = 0;
    local_48.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    uStack_38 = 0;
    local_48.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
         CONCAT22(uVar5 << 8 | uVar5 >> 8,2);
    local_48.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (ulong)(uint)local_48.
                      super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::
    make_unique<asio::basic_socket_acceptor<asio::ip::tcp>,asio::io_context&,asio::ip::basic_endpoint<asio::ip::tcp>>
              ((io_context *)local_60,
               (basic_endpoint<asio::ip::tcp> *)
               &(((execution_context_service_base<asio::detail::scheduler> *)local_60._8_8_)->
                super_service).key_);
  }
  else {
    HubContext::getnextContext((HubContext *)(local_60 + 8));
    local_48.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    uStack_38 = 0;
    local_30 = 0;
    local_48.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
         CONCAT22(uVar5 << 8 | uVar5 >> 8,10);
    local_48.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (ulong)(uint)local_48.
                      super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::
    make_unique<asio::basic_socket_acceptor<asio::ip::tcp>,asio::io_context&,asio::ip::basic_endpoint<asio::ip::tcp>>
              ((io_context *)local_60,
               (basic_endpoint<asio::ip::tcp> *)
               &(((execution_context_service_base<asio::detail::scheduler> *)local_60._8_8_)->
                super_service).key_);
  }
  __p = local_60._0_8_;
  local_60._0_8_ =
       (__uniq_ptr_impl<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
        )0x0;
  std::
  __uniq_ptr_impl<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  ::reset((__uniq_ptr_impl<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
           *)(*(long *)(CONCAT62(in_register_00000032,port.value) + 8) + 0x20),(pointer)__p);
  std::
  unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  ::~unique_ptr((unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
                 *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  lVar1 = *(long *)(CONCAT62(in_register_00000032,port.value) + 8);
  plVar2 = *(long **)(lVar1 + 0x10);
  for (plVar4 = *(long **)(lVar1 + 8); plVar4 != plVar2; plVar4 = plVar4 + 2) {
    *(undefined1 *)(*(long *)(*plVar4 + 0x38) + 0x140) = in_R8B;
  }
  std::make_shared<SL::WS_LITE::WSListener_Configuration,std::shared_ptr<SL::WS_LITE::HubContext>&>
            (&local_48);
  _Var3._M_pi = local_48.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_48.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_IWSContext_Configuration)._vptr_IWSContext_Configuration =
       (_func_int **)
       local_48.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->HubContext_).super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)_Var3._M_pi;
  local_48.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar6.super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar6.super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<SL::WS_LITE::IWSListener_Configuration>)
         sVar6.
         super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<IWSListener_Configuration> CreateListener(PortNumber port, NetworkProtocol protocol,
                                                                          ExtensionOptions options) override
        {
            if (protocol == NetworkProtocol::IPV4) {
                HubContext_->acceptor = std::make_unique<asio::ip::tcp::acceptor>(HubContext_->getnextContext()->io_service,
                                                                                  asio::ip::tcp::endpoint(asio::ip::tcp::v4(), port.value));
            }
            else {
                HubContext_->acceptor = std::make_unique<asio::ip::tcp::acceptor>(HubContext_->getnextContext()->io_service,
                                                                                  asio::ip::tcp::endpoint(asio::ip::tcp::v6(), port.value));
            }
            for (auto &t : HubContext_->ThreadContexts) {
                t->WebSocketContext_->ExtensionOptions_ = options;
            }
            return std::make_shared<WSListener_Configuration>(HubContext_);
        }